

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall
Fossilize::StateRecorder::init_recording_synchronized(StateRecorder *this,DatabaseInterface *iface)

{
  bool local_41;
  anon_struct_40_5_2613688a_for_record_data local_40;
  DatabaseInterface *local_18;
  DatabaseInterface *iface_local;
  StateRecorder *this_local;
  
  this->impl->database_iface = iface;
  local_40.write_database_entries = true;
  local_40.payload_flags = 0;
  local_40.need_flush = false;
  local_40.need_prepare = true;
  local_18 = iface;
  iface_local = (DatabaseInterface *)this;
  memset(&local_40.blob,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_40.blob);
  Impl::anon_struct_40_5_2613688a_for_record_data::operator=(&this->impl->record_data,&local_40);
  Impl::{unnamed_type#1}::~Impl((_unnamed_type_1_ *)&local_40);
  local_41 = false;
  if (this->impl->module_identifier_database_iface != (DatabaseInterface *)0x0) {
    local_41 = this->impl->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  this->impl->should_record_identifier_only = local_41;
  return;
}

Assistant:

void StateRecorder::init_recording_synchronized(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;
}